

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Output::paddedKey(Output *this,StringRef key)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  StringRef local_68;
  StringRef local_58;
  char *local_48;
  char *spaces;
  Output *local_30;
  char *local_28;
  Output *local_20;
  Output *this_local;
  StringRef key_local;
  
  local_28 = (char *)key.Length;
  local_30 = (Output *)key.Data;
  local_20 = this;
  this_local = local_30;
  key_local.Data = local_28;
  output(this,key);
  StringRef::StringRef((StringRef *)&spaces,":");
  output(this,_spaces);
  local_48 = "                ";
  sVar2 = StringRef::size((StringRef *)&this_local);
  sVar3 = strlen(local_48);
  pcVar1 = local_48;
  if (sVar2 < sVar3) {
    sVar2 = StringRef::size((StringRef *)&this_local);
    StringRef::StringRef(&local_58,pcVar1 + sVar2);
    (this->Padding).Data = local_58.Data;
    (this->Padding).Length = local_58.Length;
  }
  else {
    StringRef::StringRef(&local_68," ");
    (this->Padding).Data = local_68.Data;
    (this->Padding).Length = local_68.Length;
  }
  return;
}

Assistant:

void Output::paddedKey(StringRef key) {
  output(key);
  output(":");
  const char *spaces = "                ";
  if (key.size() < strlen(spaces))
    Padding = &spaces[key.size()];
  else
    Padding = " ";
}